

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitColorConversionCase::render(BlitColorConversionCase *this,Surface *dst)

{
  TextureFormatInfo *__return_storage_ptr__;
  float *a;
  float *falseVal;
  float *trueVal;
  float *falseVal_00;
  float *a_00;
  tcu *ptVar1;
  float *trueVal_00;
  tcu *this_00;
  bool *this_01;
  undefined1 *this_02;
  int iVar2;
  int srcY1;
  int dstX1;
  deUint32 dVar3;
  Context *pCVar4;
  int *piVar5;
  deUint32 local_6e4;
  deUint32 local_68c;
  deUint32 *local_688;
  deUint32 *local_680;
  Vector<float,_3> local_530;
  Vector<float,_3> local_524;
  Vector<float,_3> local_518;
  Vector<float,_3> local_50c;
  int local_500;
  deUint32 local_4fc;
  int ndx_1;
  deUint32 format;
  deUint32 *rbo;
  deUint32 *fbo;
  int ndx;
  deUint32 dstRbo;
  deUint32 srcRbo;
  deUint32 dstFbo;
  deUint32 srcFbo;
  deUint32 gradShaderDstID;
  deUint32 gradShaderSrcID;
  undefined1 local_4c0 [8];
  GradientShader gradientToDstShader;
  GradientShader gradientToSrcShader;
  tcu local_208 [16];
  tcu local_1f8 [4];
  tcu local_1f4 [4];
  tcu local_1f0 [16];
  tcu local_1e0 [4];
  tcu local_1dc [4];
  tcu local_1d8 [16];
  tcu local_1c8 [4];
  tcu local_1c4 [4];
  tcu local_1c0 [16];
  undefined1 local_1b0 [8];
  TextureFormatInfo dstRangeInfo;
  tcu local_15c [4];
  tcu local_158 [16];
  tcu local_148 [4];
  tcu local_144 [16];
  tcu local_134 [4];
  tcu local_130 [16];
  undefined1 local_120 [8];
  TextureFormatInfo srcRangeInfo;
  tcu local_d0 [16];
  tcu local_c0 [4];
  Functional local_bc [4];
  BVec4 srcIsGreater;
  tcu local_b4 [4];
  undefined1 local_b0 [4];
  BVec4 copyMask;
  TextureFormatInfo dstFmtRangeInfo;
  TextureFormatInfo srcFmtRangeInfo;
  DataType dstOutputType;
  DataType srcOutputType;
  TextureFormat dstFormat;
  TextureFormat srcFormat;
  Surface *dst_local;
  BlitColorConversionCase *this_local;
  
  dstFormat = glu::mapGLInternalFormat(this->m_srcFormat);
  _dstOutputType = glu::mapGLInternalFormat(this->m_dstFormat);
  srcFmtRangeInfo.lookupBias.m_data[3] = (float)FboTestUtil::getFragmentOutputType(&dstFormat);
  srcFmtRangeInfo.lookupBias.m_data[2] =
       (float)FboTestUtil::getFragmentOutputType((TextureFormat *)&dstOutputType);
  __return_storage_ptr__ = (TextureFormatInfo *)(dstFmtRangeInfo.lookupBias.m_data + 2);
  tcu::getTextureFormatInfo(__return_storage_ptr__,&dstFormat);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_b0,(TextureFormat *)&dstOutputType);
  getChannelMask((Functional *)&srcIsGreater,dstFormat.order);
  getChannelMask(local_bc,dstOutputType);
  tcu::logicalAnd<bool,4>(local_b4,(Vector<bool,_4> *)&srcIsGreater,(Vector<bool,_4> *)local_bc);
  a = srcFmtRangeInfo.valueMin.m_data + 2;
  tcu::operator-(local_d0,(Vector<float,_4> *)a,(Vector<float,_4> *)__return_storage_ptr__);
  a_00 = dstFmtRangeInfo.valueMin.m_data + 2;
  ptVar1 = (tcu *)(srcRangeInfo.lookupBias.m_data + 2);
  tcu::operator-(ptVar1,(Vector<float,_4> *)a_00,(Vector<float,_4> *)local_b0);
  tcu::greaterThan<float,4>(local_c0,(Vector<float,_4> *)local_d0,(Vector<float,_4> *)ptVar1);
  tcu::logicalAnd<bool,4>(local_134,(Vector<bool,_4> *)local_b4,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_130,(Vector<float,_4> *)local_b0,(Vector<float,_4> *)__return_storage_ptr__,
             (Vector<bool,_4> *)local_134);
  tcu::logicalAnd<bool,4>(local_148,(Vector<bool,_4> *)local_b4,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_144,(Vector<float,_4> *)a_00,(Vector<float,_4> *)a,(Vector<bool,_4> *)local_148);
  trueVal_00 = dstFmtRangeInfo.valueMax.m_data + 2;
  falseVal = srcFmtRangeInfo.valueMax.m_data + 2;
  tcu::logicalAnd<bool,4>(local_15c,(Vector<bool,_4> *)local_b4,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_158,(Vector<float,_4> *)trueVal_00,(Vector<float,_4> *)falseVal,
             (Vector<bool,_4> *)local_15c);
  trueVal = dstFmtRangeInfo.lookupScale.m_data + 2;
  falseVal_00 = srcFmtRangeInfo.lookupScale.m_data + 2;
  ptVar1 = (tcu *)(dstRangeInfo.lookupBias.m_data + 2);
  tcu::logicalAnd<bool,4>(ptVar1,(Vector<bool,_4> *)local_b4,(Vector<bool,_4> *)local_c0);
  this_00 = (tcu *)(dstRangeInfo.lookupBias.m_data + 3);
  tcu::select<float,4>
            (this_00,(Vector<float,_4> *)trueVal,(Vector<float,_4> *)falseVal_00,
             (Vector<bool,_4> *)ptVar1);
  tcu::TextureFormatInfo::TextureFormatInfo
            ((TextureFormatInfo *)local_120,(Vec4 *)local_130,(Vec4 *)local_144,(Vec4 *)local_158,
             (Vec4 *)this_00);
  tcu::logicalNot<bool,4>(local_1c8,(Vector<bool,_4> *)local_b4);
  tcu::logicalOr<bool,4>(local_1c4,(Vector<bool,_4> *)local_1c8,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_1c0,(Vector<float,_4> *)local_b0,(Vector<float,_4> *)__return_storage_ptr__,
             (Vector<bool,_4> *)local_1c4);
  tcu::logicalNot<bool,4>(local_1e0,(Vector<bool,_4> *)local_b4);
  tcu::logicalOr<bool,4>(local_1dc,(Vector<bool,_4> *)local_1e0,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_1d8,(Vector<float,_4> *)a_00,(Vector<float,_4> *)a,(Vector<bool,_4> *)local_1dc);
  tcu::logicalNot<bool,4>(local_1f8,(Vector<bool,_4> *)local_b4);
  tcu::logicalOr<bool,4>(local_1f4,(Vector<bool,_4> *)local_1f8,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_1f0,(Vector<float,_4> *)trueVal_00,(Vector<float,_4> *)falseVal,
             (Vector<bool,_4> *)local_1f4);
  this_01 = &gradientToSrcShader.super_ShaderProgram.m_hasGeometryShader;
  tcu::logicalNot<bool,4>((tcu *)this_01,(Vector<bool,_4> *)local_b4);
  this_02 = &gradientToSrcShader.super_ShaderProgram.field_0x154;
  tcu::logicalOr<bool,4>((tcu *)this_02,(Vector<bool,_4> *)this_01,(Vector<bool,_4> *)local_c0);
  tcu::select<float,4>
            (local_208,(Vector<float,_4> *)trueVal,(Vector<float,_4> *)falseVal_00,
             (Vector<bool,_4> *)this_02);
  tcu::TextureFormatInfo::TextureFormatInfo
            ((TextureFormatInfo *)local_1b0,(Vec4 *)local_1c0,(Vec4 *)local_1d8,(Vec4 *)local_1f0,
             (Vec4 *)local_208);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&gradientToDstShader.super_ShaderProgram.m_hasGeometryShader,
             (DataType)srcFmtRangeInfo.lookupBias.m_data[3]);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)local_4c0,(DataType)srcFmtRangeInfo.lookupBias.m_data[2]);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  srcFbo = (*pCVar4->_vptr_Context[0x75])
                     (pCVar4,&gradientToDstShader.super_ShaderProgram.m_hasGeometryShader);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dstFbo = (*pCVar4->_vptr_Context[0x75])(pCVar4,local_4c0);
  for (fbo._0_4_ = 0; (int)fbo < 2; fbo._0_4_ = (int)fbo + 1) {
    if ((int)fbo == 0) {
      local_680 = &srcRbo;
    }
    else {
      local_680 = &dstRbo;
    }
    rbo = local_680;
    if ((int)fbo == 0) {
      local_688 = (deUint32 *)&ndx;
    }
    else {
      local_688 = (deUint32 *)((long)&fbo + 4);
    }
    _ndx_1 = local_688;
    if ((int)fbo == 0) {
      local_68c = this->m_srcFormat;
    }
    else {
      local_68c = this->m_dstFormat;
    }
    local_4fc = local_68c;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,local_680);
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,_ndx_1);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,*_ndx_1);
    dVar3 = local_4fc;
    piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
    iVar2 = *piVar5;
    piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
    sglr::ContextWrapper::glRenderbufferStorage
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,dVar3,iVar2,*piVar5);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,*rbo);
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,*_ndx_1);
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  }
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,*piVar5);
  for (local_500 = 0; local_500 < 2; local_500 = local_500 + 1) {
    if (local_500 == 0) {
      local_6e4 = srcRbo;
    }
    else {
      local_6e4 = dstRbo;
    }
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,local_6e4);
    if (local_500 == 0) {
      pCVar4 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      FboTestUtil::GradientShader::setGradient
                ((GradientShader *)&gradientToDstShader.super_ShaderProgram.m_hasGeometryShader,
                 pCVar4,srcFbo,(Vec4 *)local_120,(Vec4 *)(dstRangeInfo.valueMin.m_data + 2));
      pCVar4 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar3 = srcFbo;
      tcu::Vector<float,_3>::Vector(&local_524,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_530,1.0,1.0,0.0);
      sglr::drawQuad(pCVar4,dVar3,&local_524,&local_530);
    }
    else {
      pCVar4 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      FboTestUtil::GradientShader::setGradient
                ((GradientShader *)local_4c0,pCVar4,dstFbo,
                 (Vec4 *)(dstRangeInfo.valueMin.m_data + 2),(Vec4 *)local_1b0);
      pCVar4 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboTestCase).super_ContextWrapper);
      dVar3 = dstFbo;
      tcu::Vector<float,_3>::Vector(&local_50c,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_518,1.0,1.0,0.0);
      sglr::drawQuad(pCVar4,dVar3,&local_50c,&local_518);
    }
  }
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,srcRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,dstRbo);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
  srcY1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  dstX1 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glBlitFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,srcY1,0,0,dstX1,*piVar5,
             0x4000,0x2600);
  FboTestCase::checkError(&this->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,dstRbo);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_size);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar2,*piVar5,(TextureFormat *)&dstOutputType,
             (Vec4 *)(dstRangeInfo.valueMax.m_data + 2),
             (Vec4 *)(dstRangeInfo.lookupScale.m_data + 2));
  FboTestUtil::GradientShader::~GradientShader((GradientShader *)local_4c0);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)&gradientToDstShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		srcFormat			= glu::mapGLInternalFormat(m_srcFormat);
		tcu::TextureFormat		dstFormat			= glu::mapGLInternalFormat(m_dstFormat);
		glu::DataType			srcOutputType		= getFragmentOutputType(srcFormat);
		glu::DataType			dstOutputType		= getFragmentOutputType(dstFormat);

		// Compute ranges \note Doesn't handle case where src or dest is not subset of the another!
		tcu::TextureFormatInfo	srcFmtRangeInfo		= tcu::getTextureFormatInfo(srcFormat);
		tcu::TextureFormatInfo	dstFmtRangeInfo		= tcu::getTextureFormatInfo(dstFormat);
		tcu::BVec4				copyMask			= tcu::logicalAnd(getChannelMask(srcFormat.order), getChannelMask(dstFormat.order));
		tcu::BVec4				srcIsGreater		= tcu::greaterThan(srcFmtRangeInfo.valueMax-srcFmtRangeInfo.valueMin, dstFmtRangeInfo.valueMax-dstFmtRangeInfo.valueMin);
		tcu::TextureFormatInfo	srcRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalAnd(copyMask, srcIsGreater)));
		tcu::TextureFormatInfo	dstRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)));

		// Shaders.
		GradientShader			gradientToSrcShader	(srcOutputType);
		GradientShader			gradientToDstShader	(dstOutputType);

		deUint32				gradShaderSrcID		= getCurrentContext()->createProgram(&gradientToSrcShader);
		deUint32				gradShaderDstID		= getCurrentContext()->createProgram(&gradientToDstShader);

		deUint32				srcFbo, dstFbo;
		deUint32				srcRbo, dstRbo;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo		= ndx ? dstFbo : srcFbo;
			deUint32&	rbo		= ndx ? dstRbo : srcRbo;
			deUint32	format	= ndx ? m_dstFormat : m_srcFormat;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &rbo);

			glBindRenderbuffer(GL_RENDERBUFFER, rbo);
			glRenderbufferStorage(GL_RENDERBUFFER, format, m_size.x(), m_size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glViewport(0, 0, m_size.x(), m_size.y());

		// Render gradients.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			glBindFramebuffer(GL_FRAMEBUFFER, ndx ? dstFbo : srcFbo);

			if (ndx)
			{
				gradientToDstShader.setGradient(*getCurrentContext(), gradShaderDstID, dstRangeInfo.valueMax, dstRangeInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), gradShaderDstID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
			else
			{
				gradientToSrcShader.setGradient(*getCurrentContext(), gradShaderSrcID, srcRangeInfo.valueMin, dstRangeInfo.valueMax);
				sglr::drawQuad(*getCurrentContext(), gradShaderSrcID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
		}

		// Execute copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
		checkError();

		// Read results.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, dstFbo);
		readPixels(dst, 0, 0, m_size.x(), m_size.y(), dstFormat, dstRangeInfo.lookupScale, dstRangeInfo.lookupBias);
	}